

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

EdgePolyline * __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalk
          (EdgePolyline *__return_storage_ptr__,PolylineBuilder *this,VertexId v)

{
  ulong *puVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __position;
  _Bit_type *p_Var5;
  bool bVar6;
  long lVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  EdgeId e;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  EdgeId best_edge;
  int local_44;
  int local_40;
  uint local_3c;
  btree_map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &this->excess_used_;
  local_3c = 0;
  local_40 = v;
  do {
    local_44 = -1;
    lVar7 = (long)local_40;
    piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar13 = piVar3[lVar7];
    uVar10 = (ulong)iVar13;
    iVar2 = piVar3[lVar7 + 1];
    iVar12 = 0x7fffffff;
    if (iVar13 != iVar2) {
      do {
        uVar9 = uVar10 + 0x3f;
        if (-1 < (long)uVar10) {
          uVar9 = uVar10;
        }
        if ((((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)uVar9 >> 6) +
               (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
              (uVar10 & 0x3f) & 1) == 0) &&
           (iVar13 = (this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10], iVar13 < iVar12)) {
          local_44 = (int)uVar10;
          iVar12 = iVar13;
        }
        uVar10 = uVar10 + 1;
      } while (iVar2 != (int)uVar10);
    }
    if (local_44 < 0) {
      local_3c = (uint)CONCAT71((int7)(int3)((uint)local_40 >> 8),1);
LAB_001c4f9c:
      bVar14 = false;
    }
    else {
      if (this->directed_ == true) {
        piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar13 = (piVar4[lVar7 + 1] + piVar3[lVar7]) - (piVar4[lVar7] + piVar3[lVar7 + 1]);
      }
      else {
        piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar13 = (piVar3[lVar7 + 1] - piVar3[lVar7]) % 2;
      }
      pmVar8 = gtl::internal_btree::
               btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::operator[](&local_38->
                             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            ,&local_40);
      if (this->directed_ == true) {
        if (iVar13 - *pmVar8 < 0) {
LAB_001c4f61:
          piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          iVar13 = piVar3[local_40];
          iVar2 = piVar3[(long)local_40 + 1];
          bVar14 = iVar13 == iVar2;
          if (!bVar14) {
            lVar7 = (long)iVar13 << 2;
            do {
              iVar13 = *(int *)((long)(this->in_).in_edge_ids_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar7);
              uVar9 = (ulong)iVar13;
              uVar10 = uVar9 + 0x3f;
              if (-1 < (long)uVar9) {
                uVar10 = uVar9;
              }
              if ((((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar10 >> 6) +
                     (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                    ] >> (uVar9 & 0x3f) & 1) == 0) &&
                 ((this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] <= iVar12)) {
                local_3c = (uint)CONCAT71((int7)(int3)((uint)iVar13 >> 8),1);
                bVar6 = false;
              }
              else {
                bVar6 = true;
              }
              if (!bVar6) break;
              lVar7 = lVar7 + 4;
              bVar14 = (long)iVar2 * 4 == lVar7;
            } while (!bVar14);
          }
          if (!bVar14) goto LAB_001c4f9c;
        }
      }
      else if ((iVar13 - *pmVar8 & 0x80000001U) == 1) goto LAB_001c4f61;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_44);
      }
      else {
        *__position._M_current = local_44;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar9 = (ulong)local_44;
      p_Var5 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar10 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar10 = uVar9;
      }
      puVar1 = p_Var5 + ((long)uVar10 >> 6) +
                        (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)local_44 & 0x3f);
      if (this->directed_ == false) {
        iVar13 = (this->sibling_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        uVar11 = (ulong)iVar13;
        uVar10 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar10 = uVar11;
        }
        puVar1 = p_Var5 + ((long)uVar10 >> 6) +
                          (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff;
        *puVar1 = *puVar1 | 1L << ((byte)iVar13 & 0x3f);
      }
      this->edges_left_ = this->edges_left_ + -1;
      local_40 = (this->g_->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar9].second;
      bVar14 = true;
    }
    if (!bVar14) {
      if (((local_3c & 1) == 0) &&
         (piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start, piVar3 != (pointer)0x0)) {
        operator_delete(piVar3);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Graph::EdgePolyline Graph::PolylineBuilder::BuildWalk(VertexId v) {
  EdgePolyline polyline;
  for (;;) {
    // Follow the edge with the smallest input edge id.
    EdgeId best_edge = -1;
    InputEdgeId best_out_id = std::numeric_limits<InputEdgeId>::max();
    for (EdgeId e : out_.edge_ids(v)) {
      if (used_[e] || min_input_ids_[e] >= best_out_id) continue;
      best_out_id = min_input_ids_[e];
      best_edge = e;
    }
    if (best_edge < 0) return polyline;
    // For idempotency when there are multiple input polylines, we stop the
    // walk early if "best_edge" might be a continuation of a different
    // incoming edge.
    int excess = excess_degree(v) - excess_used_[v];
    if (directed_ ? (excess < 0) : (excess % 2) == 1) {
      for (EdgeId e : in_.edge_ids(v)) {
        if (!used_[e] && min_input_ids_[e] <= best_out_id) {
          return polyline;
        }
      }
    }
    polyline.push_back(best_edge);
    used_[best_edge] = true;
    if (!directed_) used_[sibling_map_[best_edge]] = true;
    --edges_left_;
    v = g_.edge(best_edge).second;
  }
}